

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcombobox.cpp
# Opt level: O2

void __thiscall
QComboBoxPrivateContainer::QComboBoxPrivateContainer
          (QComboBoxPrivateContainer *this,QAbstractItemView *itemView,QComboBox *parent)

{
  long lVar1;
  int iVar2;
  QLayout *this_00;
  QStyle *pQVar3;
  QComboBoxPrivateScroller *pQVar4;
  long in_FS_OFFSET;
  undefined1 local_e8 [16];
  undefined8 local_d8;
  undefined1 local_d0 [8];
  QStyleOptionComboBox opt;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QFrame::QFrame(&this->super_QFrame,&parent->super_QWidget,(WindowFlags)0x9);
  *(undefined ***)&(this->super_QFrame).super_QWidget = &PTR_metaObject_007c9a18;
  *(undefined ***)&(this->super_QFrame).super_QWidget.super_QPaintDevice =
       &PTR__QComboBoxPrivateContainer_007c9bd0;
  QTimer::QTimer(&this->blockMouseReleaseTimer,(QObject *)0x0);
  this->adjustSizeTimer = Invalid;
  (this->initialClickPosition).xp = 0;
  (this->initialClickPosition).yp.m_i = 0;
  this->combo = parent;
  this->view = (QAbstractItemView *)0x0;
  this->top = (QComboBoxPrivateScroller *)0x0;
  this->bottom = (QComboBoxPrivateScroller *)0x0;
  (this->popupTimer).t1 = -0x8000000000000000;
  (this->popupTimer).t2 = -0x8000000000000000;
  this->maybeIgnoreMouseButtonRelease = false;
  QWidget::setAttribute((QWidget *)this,WA_WindowPropagation,true);
  QWidget::setAttribute((QWidget *)this,WA_X11NetWmWindowTypeCombo,true);
  QTimer::setSingleShot(SUB81(&this->blockMouseReleaseTimer,0));
  this_00 = (QLayout *)operator_new(0x20);
  QBoxLayout::QBoxLayout((QBoxLayout *)this_00,Down,(QWidget *)this);
  (**(code **)(*(long *)this_00 + 0x68))(this_00,0);
  opt.super_QStyleOptionComplex.super_QStyleOption.version = 0;
  opt.super_QStyleOptionComplex.super_QStyleOption.type = 0;
  opt.super_QStyleOptionComplex.super_QStyleOption.state.
  super_QFlagsStorageHelper<QStyle::StateFlag,_4>.super_QFlagsStorage<QStyle::StateFlag>.i =
       (QFlagsStorageHelper<QStyle::StateFlag,_4>)0x0;
  opt.super_QStyleOptionComplex.super_QStyleOption.direction = LeftToRight;
  QLayout::setContentsMargins(this_00,(QMargins *)&opt);
  setItemView(this,itemView);
  memset(&opt,0xaa,0x90);
  comboStyleOption(&opt,this);
  pQVar3 = QWidget::style(&this->combo->super_QWidget);
  iVar2 = (**(code **)(*(long *)pQVar3 + 0xf0))(pQVar3,0x19,&opt);
  if (iVar2 == 0) {
    QFrame::setLineWidth(&this->super_QFrame,1);
  }
  else {
    pQVar4 = (QComboBoxPrivateScroller *)operator_new(0x38);
    QComboBoxPrivateScroller::QComboBoxPrivateScroller(pQVar4,SliderSingleStepSub,(QWidget *)this);
    this->top = pQVar4;
    pQVar4 = (QComboBoxPrivateScroller *)operator_new(0x38);
    QComboBoxPrivateScroller::QComboBoxPrivateScroller(pQVar4,SliderSingleStepAdd,(QWidget *)this);
    this->bottom = pQVar4;
    QWidget::hide(&this->top->super_QWidget);
    QWidget::hide(&this->bottom->super_QWidget);
  }
  if (this->top != (QComboBoxPrivateScroller *)0x0) {
    QBoxLayout::insertWidget((QBoxLayout *)this_00,0,&this->top->super_QWidget,0,(Alignment)0x0);
    local_e8._8_8_ = scrollItemView;
    local_d8._0_1_ = (QPaintDevice)0x0;
    local_d8._1_7_ = 0;
    QObject::connect<void(QComboBoxPrivateScroller::*)(int),void(QComboBoxPrivateContainer::*)(int)>
              ((Object *)local_d0,(offset_in_QComboBoxPrivateScroller_to_subr)this->top,
               (ContextType *)QComboBoxPrivateScroller::doScroll,
               (offset_in_QComboBoxPrivateContainer_to_subr *)0x0,(ConnectionType)this);
    QMetaObject::Connection::~Connection((Connection *)local_d0);
  }
  if (this->bottom != (QComboBoxPrivateScroller *)0x0) {
    QBoxLayout::addWidget((QBoxLayout *)this_00,&this->bottom->super_QWidget,0,(Alignment)0x0);
    local_e8._8_8_ = scrollItemView;
    local_d8._0_1_ = (QPaintDevice)0x0;
    local_d8._1_7_ = 0;
    QObject::connect<void(QComboBoxPrivateScroller::*)(int),void(QComboBoxPrivateContainer::*)(int)>
              ((Object *)local_e8,(offset_in_QComboBoxPrivateScroller_to_subr)this->bottom,
               (ContextType *)QComboBoxPrivateScroller::doScroll,
               (offset_in_QComboBoxPrivateContainer_to_subr *)0x0,(ConnectionType)this);
    QMetaObject::Connection::~Connection((Connection *)local_e8);
  }
  QBoxLayout::insertSpacing((QBoxLayout *)this_00,0,0);
  QBoxLayout::addSpacing((QBoxLayout *)this_00,0);
  updateStyleSettings(this);
  QStyleOptionComboBox::~QStyleOptionComboBox(&opt);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QComboBoxPrivateContainer::QComboBoxPrivateContainer(QAbstractItemView *itemView, QComboBox *parent)
    : QFrame(parent, Qt::Popup), combo(parent)
{
    // we need the combobox and itemview
    Q_ASSERT(parent);
    Q_ASSERT(itemView);

    setAttribute(Qt::WA_WindowPropagation);
    setAttribute(Qt::WA_X11NetWmWindowTypeCombo);

    // setup container
    blockMouseReleaseTimer.setSingleShot(true);

    // we need a vertical layout
    QBoxLayout *layout =  new QBoxLayout(QBoxLayout::TopToBottom, this);
    layout->setSpacing(0);
    layout->setContentsMargins(QMargins());

    // set item view
    setItemView(itemView);

    // add scroller arrows if style needs them
    QStyleOptionComboBox opt = comboStyleOption();
    const bool usePopup = combo->style()->styleHint(QStyle::SH_ComboBox_Popup, &opt, combo);
    if (usePopup) {
        top = new QComboBoxPrivateScroller(QAbstractSlider::SliderSingleStepSub, this);
        bottom = new QComboBoxPrivateScroller(QAbstractSlider::SliderSingleStepAdd, this);
        top->hide();
        bottom->hide();
    } else {
        setLineWidth(1);
    }

    if (top) {
        layout->insertWidget(0, top);
        connect(top, &QComboBoxPrivateScroller::doScroll,
                this, &QComboBoxPrivateContainer::scrollItemView);
    }
    if (bottom) {
        layout->addWidget(bottom);
        connect(bottom, &QComboBoxPrivateScroller::doScroll,
                this, &QComboBoxPrivateContainer::scrollItemView);
    }

    // Some styles (Mac) have a margin at the top and bottom of the popup.
    layout->insertSpacing(0, 0);
    layout->addSpacing(0);
    updateStyleSettings();
}